

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_int,float>
          (Thread *this,BinopFunc<unsigned_int,_float> *f)

{
  float fVar1;
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  uint uVar2;
  float *pfVar3;
  uint *puVar4;
  byte local_49;
  undefined1 auStack_48 [7];
  u8 i;
  SR result;
  Simd<float,_(unsigned_char)__x04_> lhs;
  Simd<float,_(unsigned_char)__x04_> rhs;
  BinopFunc<unsigned_int,_float> *f_local;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  for (local_49 = 0; local_49 < 4; local_49 = local_49 + 1) {
    pfVar3 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)(result.v + 2),local_49);
    fVar1 = *pfVar3;
    pfVar3 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)(lhs.v + 2),local_49);
    uVar2 = (*f)(fVar1,*pfVar3);
    puVar4 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)auStack_48,local_49);
    *puVar4 = uVar2;
  }
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = auStack_48._0_4_;
  value.v[1] = stack0xffffffffffffffbc;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}